

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

null_terminating_iterator<wchar_t>
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
          (null_terminating_iterator<wchar_t> it,
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
          *handler)

{
  null_terminating_iterator<wchar_t> it_00;
  null_terminating_iterator<wchar_t> it_01;
  null_terminating_iterator<wchar_t> nVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *psVar2;
  bool bVar3;
  wchar_t wVar4;
  uint uVar5;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  null_terminating_iterator<wchar_t> nVar6;
  null_terminating_iterator<wchar_t> p;
  int i;
  alignment align;
  char_type c;
  undefined4 in_stack_fffffffffffffe78;
  alignment in_stack_fffffffffffffe7c;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_stack_fffffffffffffe80;
  null_terminating_iterator<wchar_t> in_stack_fffffffffffffea8;
  null_terminating_iterator<wchar_t> local_148;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_138;
  null_terminating_iterator<wchar_t> local_130;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  *in_stack_fffffffffffffee0;
  wchar_t *in_stack_fffffffffffffee8;
  wchar_t *in_stack_fffffffffffffef0;
  wchar_t *pwVar7;
  null_terminating_iterator<wchar_t> local_100;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_f0;
  null_terminating_iterator<wchar_t> local_e8;
  null_terminating_iterator<wchar_t> local_d8;
  null_terminating_iterator<wchar_t> local_c8;
  null_terminating_iterator<wchar_t> local_b8;
  null_terminating_iterator<wchar_t> local_a8;
  null_terminating_iterator<wchar_t> local_98;
  null_terminating_iterator<wchar_t> local_88;
  null_terminating_iterator<wchar_t> local_78;
  null_terminating_iterator<wchar_t> local_68;
  wchar_t *local_58;
  wchar_t *local_50;
  null_terminating_iterator<wchar_t> local_48;
  int local_34;
  int local_30;
  wchar_t local_2c;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *local_28;
  null_terminating_iterator<wchar_t> local_20;
  wchar_t *local_10;
  wchar_t *local_8;
  
  local_28 = in_RDX;
  local_20.ptr_ = in_RDI;
  local_20.end_ = in_RSI;
  local_2c = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if ((local_2c == L'}') || (local_2c == L'\0')) {
    local_10 = local_20.ptr_;
    local_8 = local_20.end_;
    goto LAB_0016248b;
  }
  local_30 = 0;
  local_34 = 1;
  do {
    local_48 = null_terminating_iterator<wchar_t>::operator+
                         ((null_terminating_iterator<wchar_t> *)in_stack_fffffffffffffe80,
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_48);
    switch(wVar4) {
    case L'<':
      local_30 = 1;
      break;
    case L'=':
      local_30 = 4;
      break;
    case L'>':
      local_30 = 2;
      break;
    case L'^':
      local_30 = 3;
    }
    if (local_30 != 0) {
      local_58 = local_20.ptr_;
      local_50 = local_20.end_;
      nVar6.end_ = local_20.end_;
      nVar6.ptr_ = local_20.ptr_;
      bVar3 = null_terminating_iterator<wchar_t>::operator!=(&local_48,nVar6);
      if (bVar3) {
        if (local_2c == L'{') {
          specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_error(&in_stack_fffffffffffffe80->
                      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          local_10 = local_20.ptr_;
          local_8 = local_20.end_;
          goto LAB_0016248b;
        }
        local_68 = null_terminating_iterator<wchar_t>::operator+=(&local_20,2);
        specs_setter<wchar_t>::on_fill((specs_setter<wchar_t> *)local_28,local_2c);
      }
      else {
        local_78 = null_terminating_iterator<wchar_t>::operator++(&local_20);
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_align(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      break;
    }
    local_34 = local_34 + -1;
  } while (-1 < local_34);
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if (wVar4 == L' ') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_space(in_stack_fffffffffffffe80);
    local_a8 = null_terminating_iterator<wchar_t>::operator++(&local_20);
  }
  else if (wVar4 == L'+') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_plus(in_stack_fffffffffffffe80);
    local_88 = null_terminating_iterator<wchar_t>::operator++(&local_20);
  }
  else if (wVar4 == L'-') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_minus(in_stack_fffffffffffffe80);
    local_98 = null_terminating_iterator<wchar_t>::operator++(&local_20);
  }
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if (wVar4 == L'#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_hash(in_stack_fffffffffffffe80);
    local_b8 = null_terminating_iterator<wchar_t>::operator++(&local_20);
  }
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if (wVar4 == L'0') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::on_zero(in_stack_fffffffffffffe80);
    local_c8 = null_terminating_iterator<wchar_t>::operator++(&local_20);
  }
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if ((wVar4 < L'0') ||
     (wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20), psVar2 = local_28,
     L'9' < wVar4)) {
    wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
    if (wVar4 == L'{') {
      local_e8 = null_terminating_iterator<wchar_t>::operator+
                           ((null_terminating_iterator<wchar_t> *)in_stack_fffffffffffffe80,
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::width_adapter(&local_f0,local_28);
      it_00.end_ = in_stack_fffffffffffffef0;
      it_00.ptr_ = in_stack_fffffffffffffee8;
      local_d8 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                           (it_00,(width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                                   *)in_stack_fffffffffffffee0);
      local_20.ptr_ = local_d8.ptr_;
      local_20.end_ = local_d8.end_;
      local_100 = null_terminating_iterator<wchar_t>::operator++(&local_20,0);
      wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_100);
      if (wVar4 != L'}') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_error(&in_stack_fffffffffffffe80->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_10 = local_20.ptr_;
        local_8 = local_20.end_;
        goto LAB_0016248b;
      }
    }
  }
  else {
    uVar5 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                      ((null_terminating_iterator<wchar_t> *)in_stack_fffffffffffffea8.end_,
                       (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                        *)in_stack_fffffffffffffea8.ptr_);
    specs_setter<wchar_t>::on_width((specs_setter<wchar_t> *)psVar2,uVar5);
  }
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if (wVar4 == L'.') {
    nVar6 = null_terminating_iterator<wchar_t>::operator++(&local_20);
    pwVar7 = nVar6.ptr_;
    wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
    if ((wVar4 < L'0') ||
       (wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20), psVar2 = local_28,
       L'9' < wVar4)) {
      wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
      if (wVar4 != L'{') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_error(&in_stack_fffffffffffffe80->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_10 = local_20.ptr_;
        local_8 = local_20.end_;
        goto LAB_0016248b;
      }
      local_130 = null_terminating_iterator<wchar_t>::operator+
                            ((null_terminating_iterator<wchar_t> *)in_stack_fffffffffffffe80,
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
      ::precision_adapter(&local_138,local_28);
      it_01.end_ = pwVar7;
      it_01.ptr_ = in_stack_fffffffffffffee8;
      nVar6 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                        (it_01,in_stack_fffffffffffffee0);
      local_20.ptr_ = nVar6.ptr_;
      local_20.end_ = nVar6.end_;
      local_148 = null_terminating_iterator<wchar_t>::operator++(&local_20,0);
      wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_148);
      if (wVar4 != L'}') {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_error(&in_stack_fffffffffffffe80->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_10 = local_20.ptr_;
        local_8 = local_20.end_;
        goto LAB_0016248b;
      }
    }
    else {
      uVar5 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                        ((null_terminating_iterator<wchar_t> *)in_stack_fffffffffffffea8.end_,
                         (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                          *)in_stack_fffffffffffffea8.ptr_);
      specs_setter<wchar_t>::on_precision((specs_setter<wchar_t> *)psVar2,uVar5);
    }
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
    ::end_precision(in_stack_fffffffffffffe80);
  }
  wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20);
  if ((wVar4 != L'}') &&
     (wVar4 = null_terminating_iterator<wchar_t>::operator*(&local_20), wVar4 != L'\0')) {
    null_terminating_iterator<wchar_t>::operator++(&local_20,0);
    wVar4 = null_terminating_iterator<wchar_t>::operator*
                      ((null_terminating_iterator<wchar_t> *)&stack0xfffffffffffffea8);
    specs_setter<wchar_t>::on_type((specs_setter<wchar_t> *)local_28,wVar4);
  }
  local_10 = local_20.ptr_;
  local_8 = local_20.end_;
LAB_0016248b:
  nVar1.end_ = local_8;
  nVar1.ptr_ = local_10;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}